

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderNavHighlight(ImRect *bb,ImGuiID id,ImGuiNavHighlightFlags flags)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ImU32 IVar12;
  undefined4 unaff_EBP;
  int iVar13;
  float fVar14;
  float fVar16;
  ImVec2 IVar15;
  float local_8c;
  ImVec2 local_88;
  ImVec2 IStack_80;
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  ImVec4 local_58;
  ImVec2 local_40;
  ImVec2 local_38;
  
  if ((GImGui->NavId == id) &&
     ((((flags & 4U) != 0 || (GImGui->NavDisableHighlight == false)) &&
      (pIVar1 = GImGui->CurrentWindow, (pIVar1->DC).NavHideHighlightOneFrame == false)))) {
    local_8c = 0.0;
    if ((flags & 8U) == 0) {
      local_8c = (GImGui->Style).FrameRounding;
    }
    local_88.x = (bb->Min).x;
    local_88.y = (bb->Min).y;
    IStack_80.x = (bb->Max).x;
    IStack_80.y = (bb->Max).y;
    fVar4 = (pIVar1->ClipRect).Min.x;
    fVar5 = (pIVar1->ClipRect).Min.y;
    fVar6 = (pIVar1->ClipRect).Max.x;
    fVar7 = (pIVar1->ClipRect).Max.y;
    local_88.x = (float)(~-(uint)(fVar4 <= local_88.x) & (uint)fVar4 |
                        (uint)local_88.x & -(uint)(fVar4 <= local_88.x));
    local_88.y = (float)(~-(uint)(fVar5 <= local_88.y) & (uint)fVar5 |
                        (uint)local_88.y & -(uint)(fVar5 <= local_88.y));
    IStack_80.x = (float)(~-(uint)(IStack_80.x < fVar6) & (uint)fVar6 |
                         (uint)IStack_80.x & -(uint)(IStack_80.x < fVar6));
    IStack_80.y = (float)(~-(uint)(IStack_80.y < fVar7) & (uint)fVar7 |
                         (uint)IStack_80.y & -(uint)(IStack_80.y < fVar7));
    if ((flags & 1U) != 0) {
      fVar14 = local_88.x + -4.0;
      fVar16 = local_88.y + -4.0;
      IStack_80.x = IStack_80.x + 4.0;
      IStack_80.y = IStack_80.y + 4.0;
      local_88.y = fVar16;
      local_88.x = fVar14;
      auVar3._4_4_ = -(uint)(IStack_80.y <= fVar7);
      auVar3._0_4_ = -(uint)(IStack_80.x <= fVar6);
      auVar3._8_4_ = -(uint)(fVar4 <= fVar14);
      auVar3._12_4_ = -(uint)(fVar5 <= fVar16);
      iVar13 = movmskps(unaff_EBP,auVar3);
      if (iVar13 == 0xf) {
        IVar15.y = IStack_80.y;
        IVar15.x = IStack_80.x;
      }
      else {
        local_68 = local_88;
        uStack_60 = 0;
        local_78 = IStack_80;
        uStack_70 = 0;
        ImDrawList::PushClipRect(pIVar1->DrawList,local_88,IStack_80,false);
        fVar14 = local_68.x;
        fVar16 = local_68.y;
        IVar15 = local_78;
      }
      pIVar2 = pIVar1->DrawList;
      local_38.y = fVar16 + 1.0;
      local_38.x = fVar14 + 1.0;
      local_40.x = IVar15.x + -1.0;
      local_40.y = IVar15.y + -1.0;
      local_58.x = (GImGui->Style).Colors[0x31].x;
      local_58.y = (GImGui->Style).Colors[0x31].y;
      uVar8 = (GImGui->Style).Colors[0x31].z;
      uVar9 = (GImGui->Style).Colors[0x31].w;
      local_58.w = (GImGui->Style).Alpha * (float)uVar9;
      local_58.z = (float)uVar8;
      IVar12 = ColorConvertFloat4ToU32(&local_58);
      ImDrawList::AddRect(pIVar2,&local_38,&local_40,IVar12,local_8c,0xf,2.0);
      if ((char)iVar13 != '\x0f') {
        ImDrawList::PopClipRect(pIVar1->DrawList);
      }
    }
    if ((flags & 2U) != 0) {
      pIVar2 = pIVar1->DrawList;
      local_58.x = (GImGui->Style).Colors[0x31].x;
      local_58.y = (GImGui->Style).Colors[0x31].y;
      uVar10 = (GImGui->Style).Colors[0x31].z;
      uVar11 = (GImGui->Style).Colors[0x31].w;
      local_58.w = (GImGui->Style).Alpha * (float)uVar11;
      local_58.z = (float)uVar10;
      IVar12 = ColorConvertFloat4ToU32(&local_58);
      ImDrawList::AddRect(pIVar2,&local_88,&IStack_80,IVar12,local_8c,-1,1.0);
    }
  }
  return;
}

Assistant:

void ImGui::RenderNavHighlight(const ImRect& bb, ImGuiID id, ImGuiNavHighlightFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (id != g.NavId)
        return;
    if (g.NavDisableHighlight && !(flags & ImGuiNavHighlightFlags_AlwaysDraw))
        return;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->DC.NavHideHighlightOneFrame)
        return;

    float rounding = (flags & ImGuiNavHighlightFlags_NoRounding) ? 0.0f : g.Style.FrameRounding;
    ImRect display_rect = bb;
    display_rect.ClipWith(window->ClipRect);
    if (flags & ImGuiNavHighlightFlags_TypeDefault)
    {
        const float THICKNESS = 2.0f;
        const float DISTANCE = 3.0f + THICKNESS * 0.5f;
        display_rect.Expand(ImVec2(DISTANCE, DISTANCE));
        bool fully_visible = window->ClipRect.Contains(display_rect);
        if (!fully_visible)
            window->DrawList->PushClipRect(display_rect.Min, display_rect.Max);
        window->DrawList->AddRect(display_rect.Min + ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), display_rect.Max - ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), GetColorU32(ImGuiCol_NavHighlight), rounding, ImDrawCornerFlags_All, THICKNESS);
        if (!fully_visible)
            window->DrawList->PopClipRect();
    }
    if (flags & ImGuiNavHighlightFlags_TypeThin)
    {
        window->DrawList->AddRect(display_rect.Min, display_rect.Max, GetColorU32(ImGuiCol_NavHighlight), rounding, ~0, 1.0f);
    }
}